

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

bool __thiscall slang::ast::Expression::isImplicitString(Expression *this)

{
  ExpressionKind EVar1;
  Type *pTVar2;
  long lVar3;
  bool bVar4;
  MinTypMaxExpression *mtm;
  long lVar5;
  bool bVar6;
  
  lVar3 = 0x38;
  do {
    bVar4 = Type::isString((this->type).ptr);
    if (bVar4) {
      return true;
    }
    EVar1 = this->kind;
    lVar5 = lVar3;
    switch(EVar1) {
    case StringLiteral:
      return true;
    case NamedValue:
      if (((*(ParameterSymbol **)(this + 1))->super_ValueSymbol).super_Symbol.kind != Parameter) {
        return false;
      }
      bVar4 = ParameterSymbol::isImplicitString(*(ParameterSymbol **)(this + 1),this->sourceRange);
      return bVar4;
    case HierarchicalValue:
    case Inside:
    case Assignment:
    case Streaming:
    case ElementSelect:
    case RangeSelect:
    case MemberAccess:
    case Call:
      return false;
    case UnaryOp:
      lVar5 = 0x48;
      break;
    case BinaryOp:
      bVar4 = isImplicitString(*(Expression **)(this + 1));
      goto LAB_002e34f0;
    case ConditionalOp:
      bVar4 = isImplicitString((Expression *)this[1].syntax);
      lVar5 = 0x50;
LAB_002e34f0:
      if (bVar4 != false) {
        return true;
      }
      break;
    case Concatenation:
      lVar3 = *(long *)(this + 1);
      pTVar2 = this[1].type.ptr;
      lVar5 = 0;
      do {
        bVar6 = (long)pTVar2 << 3 == lVar5;
        bVar4 = !bVar6;
        if (bVar6) {
          return bVar4;
        }
        bVar6 = isImplicitString(*(Expression **)(lVar3 + lVar5));
        lVar5 = lVar5 + 8;
      } while (!bVar6);
      return bVar4;
    case Replication:
      break;
    case Conversion:
      if (1 < (int)this[1].kind) {
        return false;
      }
      break;
    default:
      if (EVar1 == ValueRange) {
        bVar4 = isImplicitString((Expression *)this[1].type.ptr);
        if (bVar4) {
          return true;
        }
        lVar5 = 0x40;
        if (this[1].kind != Invalid) {
          return false;
        }
      }
      else {
        if (EVar1 != MinTypMax) {
          return false;
        }
        lVar5 = 0x30;
      }
    }
    this = *(Expression **)((long)&this->kind + lVar5);
  } while( true );
}

Assistant:

bool Expression::isImplicitString() const {
    if (type->isString())
        return true;

    switch (kind) {
        case ExpressionKind::StringLiteral:
            return true;
        case ExpressionKind::UnaryOp:
            return as<UnaryExpression>().operand().isImplicitString();
        case ExpressionKind::BinaryOp: {
            auto& op = as<BinaryExpression>();
            return op.left().isImplicitString() || op.right().isImplicitString();
        }
        case ExpressionKind::ConditionalOp: {
            auto& op = as<ConditionalExpression>();
            return op.left().isImplicitString() || op.right().isImplicitString();
        }
        case ExpressionKind::Concatenation: {
            auto& concat = as<ConcatenationExpression>();
            for (auto op : concat.operands()) {
                if (op->isImplicitString())
                    return true;
            }
            return false;
        }
        case ExpressionKind::Replication: {
            auto& repl = as<ReplicationExpression>();
            return repl.concat().isImplicitString();
        }
        case ExpressionKind::ValueRange: {
            auto& range = as<ValueRangeExpression>();
            return range.left().isImplicitString() ||
                   (range.rangeKind == ValueRangeKind::Simple && range.right().isImplicitString());
        }
        case ExpressionKind::MinTypMax: {
            auto& mtm = as<MinTypMaxExpression>();
            return mtm.selected().isImplicitString();
        }
        case ExpressionKind::NamedValue: {
            auto& nv = as<NamedValueExpression>();
            return nv.symbol.kind == SymbolKind::Parameter &&
                   nv.symbol.as<ParameterSymbol>().isImplicitString(sourceRange);
        }
        case ExpressionKind::Conversion: {
            auto& conv = as<ConversionExpression>();
            return conv.isImplicit() && conv.operand().isImplicitString();
        }
        default:
            return false;
    }
}